

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangw.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  __u8 _Var4;
  byte bVar5;
  int iVar6;
  size_t sVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte bVar10;
  ulong uVar11;
  byte bVar12;
  undefined8 uVar13;
  char *pcVar14;
  int iVar15;
  long lVar16;
  __u8 *p_Var17;
  __u8 limit_hops;
  uint local_2b58;
  int local_2b54;
  ulong local_2b50;
  uint local_2b44;
  cgw_csum_xor cs_xor;
  uint dst_ifindex;
  uint src_ifindex;
  int local_2b30;
  uint local_2b14;
  can_filter filter;
  __u32 uid;
  canid_t local_2af8 [9];
  cgw_csum_crc8 cs_crc8;
  modattr modmsg [4];
  anon_struct_1520_3_441c1061 req;
  char crc8tab [513];
  fdmodattr fdmodmsg [4];
  uchar rxbuf [8192];
  
  limit_hops = '\0';
  cs_xor.from_idx = '\0';
  cs_xor.to_idx = '\0';
  cs_xor.result_idx = '\0';
  cs_xor.init_xor_val = '\0';
  memset(&cs_crc8,0,0x11a);
  memset(crc8tab,0,0x201);
  memset(&req,0,0x5f0);
  local_2b44 = 0;
  local_2b14 = 0;
  bVar3 = false;
  bVar2 = false;
  local_2b50 = 0;
  local_2b58 = 0;
  local_2b30 = 0;
  local_2b54 = 0;
LAB_001018b1:
  iVar6 = getopt(argc,argv,"ADFLs:d:Xteiu:l:f:c:p:x:m:M:?");
  pbVar1 = _optarg;
  if (0x62 < iVar6) {
    switch(iVar6) {
    case 99:
      iVar6 = __isoc99_sscanf(_optarg,"%hhd:%hhd:%hhd:%hhx:%hhx:%512s",&cs_crc8,&cs_crc8.to_idx,
                              &cs_crc8.result_idx,&cs_crc8.init_crc_val,&cs_crc8.final_xor_val,
                              crc8tab);
      if ((iVar6 != 6) || (sVar7 = strlen(crc8tab), sVar7 != 0x200)) {
LAB_00102869:
        pcVar14 = "Bad CRC8 checksum definition \'%s\'.\n";
        goto LAB_001028ac;
      }
      pcVar14 = crc8tab;
      lVar16 = 0;
      do {
        iVar6 = __isoc99_sscanf(pcVar14,"%2hhx",cs_crc8.crctab + lVar16);
        if (iVar6 == 0) goto LAB_00102869;
        lVar16 = lVar16 + 1;
        pcVar14 = pcVar14 + 2;
      } while (lVar16 != 0x100);
      bVar2 = true;
      goto LAB_001018b1;
    case 100:
      local_2b44 = if_nametoindex((char *)_optarg);
      if (local_2b44 == 0) {
        main_cold_1();
        goto LAB_00102905;
      }
      goto LAB_001018b1;
    case 0x65:
      local_2b58 = local_2b58 | 1;
      goto LAB_001018b1;
    case 0x66:
      iVar6 = __isoc99_sscanf(_optarg,"%x:%x",&filter,&filter.can_mask);
      if (iVar6 != 2) {
        iVar6 = __isoc99_sscanf(_optarg,"%x~%x",&filter,&filter.can_mask);
        if (iVar6 != 2) goto LAB_00102923;
        filter.can_id._3_1_ = filter.can_id._3_1_ | 0x20;
      }
      goto LAB_001018b1;
    default:
      goto switchD_001018e5_caseD_67;
    case 0x69:
      local_2b58 = local_2b58 | 4;
      goto LAB_001018b1;
    case 0x6c:
      iVar6 = __isoc99_sscanf(_optarg,"%hhu",&limit_hops);
      if ((iVar6 == 1) && (limit_hops != '\0')) goto LAB_001018b1;
      break;
    case 0x6d:
      if (local_2b30 < 4) {
        rxbuf[0] = '\0';
        rxbuf[1] = '\0';
        rxbuf[2] = '\0';
        rxbuf[3] = '\0';
        rxbuf[4] = '\0';
        rxbuf[5] = '\0';
        rxbuf[6] = '\0';
        rxbuf[7] = '\0';
        rxbuf[8] = '\0';
        rxbuf[9] = '\0';
        rxbuf[10] = '\0';
        rxbuf[0xb] = '\0';
        rxbuf[0xc] = '\0';
        rxbuf[0xd] = '\0';
        rxbuf[0xe] = '\0';
        rxbuf[0xf] = '\0';
        rxbuf[0x10] = '\0';
        pbVar8 = (byte *)strchr((char *)_optarg,0x3a);
        uVar13 = 1;
        if ((pbVar8 != pbVar1) && ((long)pbVar8 - (long)pbVar1 < 4)) {
          bVar5 = *pbVar1;
          uVar13 = 2;
          if (bVar5 < 0x53) {
            if (bVar5 == 0x41) {
              if ((pbVar1[1] == 0x4e) && (_Var4 = '\x01', pbVar1[2] == 0x44)) {
LAB_00101f3c:
                lVar16 = (long)local_2b30;
                modmsg[lVar16].instruction = _Var4;
                pbVar1 = pbVar8 + 1;
                pbVar9 = (byte *)strchr((char *)pbVar1,0x3a);
                uVar13 = 3;
                if ((pbVar9 != pbVar1) && ((long)pbVar9 - (long)pbVar1 < 4)) {
                  local_2b30 = local_2b30 + 1;
                  modmsg[lVar16].modtype = '\0';
                  pbVar8 = pbVar8 + 2;
                  bVar5 = 0;
                  do {
                    bVar10 = pbVar8[-1];
                    if (bVar10 < 0x49) {
                      if (bVar10 != 0x44) goto LAB_00101fbc;
                      bVar12 = 4;
                    }
                    else {
                      bVar12 = 1;
                      if (bVar10 != 0x49) {
                        if (bVar10 != 0x4c) goto switchD_00101e5d_caseD_45;
                        bVar12 = 2;
                      }
                    }
                    bVar5 = bVar5 | bVar12;
                    modmsg[lVar16].modtype = bVar5;
                    pbVar8 = pbVar8 + 1;
                  } while( true );
                }
              }
            }
            else if (bVar5 == 0x4f) {
              _Var4 = '\x02';
              bVar5 = pbVar1[1];
joined_r0x00101dbd:
              if (bVar5 == 0x52) goto LAB_00101f3c;
            }
          }
          else if (bVar5 == 0x53) {
            if ((pbVar1[1] == 0x45) && (_Var4 = '\x04', pbVar1[2] == 0x54)) goto LAB_00101f3c;
          }
          else if ((bVar5 == 0x58) && (pbVar1[1] == 0x4f)) {
            _Var4 = '\x03';
            bVar5 = pbVar1[2];
            goto joined_r0x00101dbd;
          }
        }
        goto LAB_00102881;
      }
      goto LAB_001018b1;
    case 0x70:
      iVar6 = __isoc99_sscanf(_optarg,"%hhu:",&cs_crc8.profile);
      if (iVar6 == 1) {
        if (cs_crc8.profile == '\x01') {
          iVar6 = __isoc99_sscanf(pbVar1,"%hhu:%2hhx",&cs_crc8.profile,cs_crc8.profile_data);
          if (iVar6 == 2) goto LAB_001018b1;
        }
        else {
          if (cs_crc8.profile == '\x03') goto LAB_001018b1;
          if (((cs_crc8.profile == '\x02') &&
              (pcVar14 = strchr((char *)pbVar1,0x3a), pcVar14 != (char *)0x0)) &&
             (sVar7 = strlen(pcVar14), sVar7 == 0x21)) {
            pcVar14 = pcVar14 + 1;
            lVar16 = 0;
            do {
              iVar6 = __isoc99_sscanf(pcVar14,"%2hhx",cs_crc8.profile_data + lVar16);
              if (iVar6 == 0) goto LAB_0010289b;
              lVar16 = lVar16 + 1;
              pcVar14 = pcVar14 + 2;
            } while (lVar16 != 0x10);
            goto LAB_001018b1;
          }
        }
      }
LAB_0010289b:
      pcVar14 = "Bad CRC8 profile definition \'%s\'.\n";
      goto LAB_001028ac;
    case 0x73:
      local_2b14 = if_nametoindex((char *)_optarg);
      if (local_2b14 != 0) goto LAB_001018b1;
      main_cold_2();
      break;
    case 0x74:
      local_2b58 = local_2b58 | 2;
      goto LAB_001018b1;
    case 0x75:
      strtoul((char *)_optarg,(char **)0x0,0x10);
      goto LAB_001018b1;
    case 0x78:
      goto switchD_001018e5_caseD_78;
    }
    pcVar14 = "Bad hop limit definition \'%s\'.\n";
    goto LAB_001028ac;
  }
  iVar15 = (int)local_2b50;
  switch(iVar6) {
  case 0x3f:
    pcVar14 = __xpg_basename(*argv);
    print_usage(pcVar14);
    exit(0);
  case 0x40:
  case 0x42:
  case 0x43:
  case 0x45:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
    goto switchD_001018e5_caseD_67;
  case 0x41:
    local_2b50 = (ulong)(iVar15 + (uint)(iVar15 == 0));
    goto LAB_001018b1;
  case 0x44:
    uVar11 = 2;
    break;
  case 0x46:
    uVar11 = 3;
    break;
  case 0x4c:
    uVar11 = 4;
    break;
  case 0x4d:
    if (local_2b54 < 4) {
      memset(rxbuf,0,0x81);
      pbVar8 = (byte *)strchr((char *)pbVar1,0x3a);
      uVar13 = 1;
      if ((pbVar8 != pbVar1) && ((long)pbVar8 - (long)pbVar1 < 4)) {
        bVar5 = *pbVar1;
        uVar13 = 2;
        if (bVar5 < 0x53) {
          if (bVar5 == 0x41) {
            if ((pbVar1[1] == 0x4e) && (_Var4 = '\x0f', pbVar1[2] == 0x44)) goto LAB_00101df9;
          }
          else if (bVar5 == 0x4f) {
            _Var4 = '\x10';
            bVar5 = pbVar1[1];
            goto joined_r0x00101a5f;
          }
        }
        else if (bVar5 == 0x53) {
          if ((pbVar1[1] == 0x45) && (_Var4 = '\x12', pbVar1[2] == 0x54)) {
LAB_00101df9:
            lVar16 = (long)local_2b54;
            fdmodmsg[lVar16].instruction = _Var4;
            pbVar1 = pbVar8 + 1;
            pbVar9 = (byte *)strchr((char *)pbVar1,0x3a);
            uVar13 = 3;
            if ((pbVar9 != pbVar1) && ((long)pbVar9 - (long)pbVar1 < 5)) {
              local_2b54 = local_2b54 + 1;
              fdmodmsg[lVar16].modtype = '\0';
              pbVar8 = pbVar8 + 2;
              bVar5 = 0;
              do {
                switch(pbVar8[-1]) {
                case 0x44:
                  bVar10 = 4;
                  break;
                case 0x45:
                case 0x47:
                case 0x48:
                case 0x4a:
                case 0x4b:
                  goto switchD_00101e5d_caseD_45;
                case 0x46:
                  bVar10 = 8;
                  break;
                case 0x49:
                  bVar10 = 1;
                  break;
                case 0x4c:
                  bVar10 = 2;
                  break;
                default:
                  goto switchD_00101e5d_default;
                }
                bVar5 = bVar5 | bVar10;
                fdmodmsg[lVar16].modtype = bVar5;
                pbVar8 = pbVar8 + 1;
              } while( true );
            }
          }
        }
        else if ((bVar5 == 0x58) && (pbVar1[1] == 0x4f)) {
          _Var4 = '\x11';
          bVar5 = pbVar1[2];
joined_r0x00101a5f:
          if (bVar5 == 0x52) goto LAB_00101df9;
        }
      }
      goto LAB_00102881;
    }
    goto LAB_001018b1;
  default:
    if (iVar6 != 0x58) {
      if (iVar6 != -1) {
switchD_001018e5_caseD_67:
        main_cold_4();
LAB_00102923:
        pcVar14 = "Bad filter definition \'%s\'.\n";
        goto LAB_001028ac;
      }
      if (((_optind == argc) && (iVar15 != 0)) &&
         ((1 < iVar15 - 1U || ((local_2b14 != 0 && (local_2b44 != 0)))))) {
        if ((local_2b58 & 8) == 0) {
          if (local_2b54 == 0) {
LAB_001020c1:
            if ((local_2b30 != 0 || local_2b54 != 0) || (!bVar2 && !bVar3)) {
              local_2b44 = socket(0x10,3,0);
              iVar6 = (*(code *)(&DAT_001030d8 + *(int *)(&DAT_001030d8 + (ulong)(iVar15 - 1U) * 4))
                      )();
              return iVar6;
            }
            pcVar14 = "-c or -x can only be used in conjunction with -m/-M";
          }
          else {
            pcVar14 = "No -M modifications allowed in Classic CAN mode!";
          }
        }
        else {
          if (local_2b30 == 0) goto LAB_001020c1;
          pcVar14 = "No -m modifications allowed in CAN FD mode!";
        }
        puts(pcVar14);
      }
      else {
        pcVar14 = __xpg_basename(*argv);
        print_usage(pcVar14);
      }
      goto LAB_001028b3;
    }
    local_2b58 = local_2b58 | 8;
    goto LAB_001018b1;
  }
  local_2b50 = local_2b50 & 0xffffffff;
  if (iVar15 == 0) {
    local_2b50 = uVar11;
  }
  goto LAB_001018b1;
switchD_00101e5d_default:
  if (pbVar8[-1] != 0x3a) goto switchD_00101e5d_caseD_45;
  iVar6 = __isoc99_sscanf(pbVar8,"%x.%hhx.%hhx.%128s",local_2af8,&fdmodmsg[lVar16].cf.flags,
                          &fdmodmsg[lVar16].cf.len,rxbuf);
  if (iVar6 != 4) goto LAB_0010290f;
  fdmodmsg[lVar16].cf.can_id = local_2af8[0];
  sVar7 = strlen((char *)rxbuf);
  if (sVar7 == 0x80) {
    p_Var17 = fdmodmsg[lVar16].cf.data;
    lVar16 = 0;
    do {
      iVar6 = __isoc99_sscanf(rxbuf + lVar16,"%2hhx",p_Var17);
      if (iVar6 == 0) goto LAB_0010287c;
      lVar16 = lVar16 + 2;
      p_Var17 = p_Var17 + 1;
    } while (lVar16 != 0x80);
    goto LAB_001018b1;
  }
  goto LAB_00102905;
switchD_001018e5_caseD_78:
  iVar6 = __isoc99_sscanf(_optarg,"%hhd:%hhd:%hhd:%hhx",&cs_xor,&cs_xor.to_idx,&cs_xor.result_idx,
                          &cs_xor.init_xor_val);
  bVar3 = true;
  if (iVar6 != 4) {
    pcVar14 = "Bad XOR checksum definition \'%s\'.\n";
LAB_001028ac:
    printf(pcVar14,_optarg);
LAB_001028b3:
    exit(1);
  }
  goto LAB_001018b1;
LAB_00101fbc:
  if (bVar10 != 0x3a) {
switchD_00101e5d_caseD_45:
    uVar13 = 4;
    goto LAB_00102881;
  }
  iVar6 = __isoc99_sscanf(pbVar8,"%x.%hhx.%16s",local_2af8,&modmsg[lVar16].cf.field_1,rxbuf);
  if (iVar6 != 3) {
LAB_0010290f:
    uVar13 = 5;
    goto LAB_00102881;
  }
  modmsg[lVar16].cf.can_id = local_2af8[0];
  sVar7 = strlen((char *)rxbuf);
  if (sVar7 == 0x10) {
    p_Var17 = modmsg[lVar16].cf.data;
    lVar16 = 0;
    do {
      iVar6 = __isoc99_sscanf(rxbuf + lVar16,"%2hhx",p_Var17);
      if (iVar6 == 0) goto LAB_0010287c;
      lVar16 = lVar16 + 2;
      p_Var17 = p_Var17 + 1;
    } while (lVar16 != 0x10);
    goto LAB_001018b1;
  }
LAB_00102905:
  uVar13 = 6;
LAB_00102881:
  printf("Problem %d with modification definition \'%s\'.\n",uVar13,_optarg);
  goto LAB_001028b3;
LAB_0010287c:
  uVar13 = 7;
  goto LAB_00102881;
}

Assistant:

int main(int argc, char **argv)
{
	int s;
	int err = 0;

	int opt;
	extern int optind, opterr, optopt;

	int cmd = UNSPEC;
	int have_filter = 0;
	int have_cs_xor = 0;
	int have_cs_crc8 = 0;

	struct {
		struct nlmsghdr nh;
		struct rtcanmsg rtcan;
		char buf[1500];
	} req;

	unsigned char rxbuf[8192]; /* netlink receive buffer */
	struct nlmsghdr *nlh;
	struct nlmsgerr *rte;
	unsigned int src_ifindex = 0;
	unsigned int dst_ifindex = 0;
	__u32 uid = 0;
	__u8 limit_hops = 0;
	__u16 flags = 0;
	int len;

	struct can_filter filter;
	struct sockaddr_nl nladdr;

	struct cgw_csum_xor cs_xor = { 0 };
	struct cgw_csum_crc8 cs_crc8 = { 0 };
	char crc8tab[513] = {0};

	struct modattr modmsg[CGW_MOD_FUNCS];
	struct fdmodattr fdmodmsg[CGW_MOD_FUNCS];
	int modidx = 0;
	int fdmodidx = 0;
	int i;

	memset(&req, 0, sizeof(req));

	while ((opt = getopt(argc, argv, "ADFLs:d:Xteiu:l:f:c:p:x:m:M:?")) != -1) {
		switch (opt) {

		case 'A':
			if (cmd == UNSPEC)
				cmd = ADD;
			break;

		case 'D':
			if (cmd == UNSPEC)
				cmd = DEL;
			break;

		case 'F':
			if (cmd == UNSPEC)
				cmd = FLUSH;
			break;

		case 'L':
			if (cmd == UNSPEC)
				cmd = LIST;
			break;

		case 's':
			src_ifindex = if_nametoindex(optarg);
			if (!src_ifindex) {
				perror("src if_nametoindex");
				exit(1);
			}
			break;

		case 'd':
			dst_ifindex = if_nametoindex(optarg);
			if (!dst_ifindex) {
				perror("dst if_nametoindex");
				exit(1);
			}
			break;

		case 'X':
			flags |= CGW_FLAGS_CAN_FD;
			break;

		case 't':
			flags |= CGW_FLAGS_CAN_SRC_TSTAMP;
			break;

		case 'e':
			flags |= CGW_FLAGS_CAN_ECHO;
			break;

		case 'i':
			flags |= CGW_FLAGS_CAN_IIF_TX_OK;
			break;

		case 'u':
			uid = strtoul(optarg, NULL, 16);
			break;

		case 'l':
			if (sscanf(optarg, "%hhu", &limit_hops) != 1 || !(limit_hops)) {
				printf("Bad hop limit definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'f':
			if (sscanf(optarg, "%x:%x", &filter.can_id,
				   &filter.can_mask) == 2) {
				have_filter = 1;
			} else if (sscanf(optarg, "%x~%x", &filter.can_id,
					  &filter.can_mask) == 2) {
				filter.can_id |= CAN_INV_FILTER;
				have_filter = 1;
			} else {
				printf("Bad filter definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'x':
			if (sscanf(optarg, "%hhd:%hhd:%hhd:%hhx",
				   &cs_xor.from_idx, &cs_xor.to_idx,
				   &cs_xor.result_idx, &cs_xor.init_xor_val) == 4) {
				have_cs_xor = 1;
			} else {
				printf("Bad XOR checksum definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'c':
			if ((sscanf(optarg, "%hhd:%hhd:%hhd:%hhx:%hhx:%512s",
				    &cs_crc8.from_idx, &cs_crc8.to_idx,
				    &cs_crc8.result_idx, &cs_crc8.init_crc_val,
				    &cs_crc8.final_xor_val, crc8tab) == 6) &&
			    (strlen(crc8tab) == 512) &&
			    (b64hex(crc8tab, (unsigned char *)&cs_crc8.crctab, 256) == 0)) {
				have_cs_crc8 = 1;
			} else {
				printf("Bad CRC8 checksum definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'p':
			if (parse_crc8_profile(optarg, &cs_crc8)) {
				printf("Bad CRC8 profile definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'm':
			/* may be triggered by each of the CGW_MOD_FUNCS functions */
			if ((modidx < CGW_MOD_FUNCS) && (err = parse_mod(optarg, &modmsg[modidx++]))) {
				printf("Problem %d with modification definition '%s'.\n", err, optarg);
				exit(1);
			}
			break;

		case 'M':
			/* may be triggered by each of the CGW_FDMOD_FUNCS functions */
			if ((fdmodidx < CGW_MOD_FUNCS) && (err = parse_fdmod(optarg, &fdmodmsg[fdmodidx++]))) {
				printf("Problem %d with modification definition '%s'.\n", err, optarg);
				exit(1);
			}
			break;

		case '?':
			print_usage(basename(argv[0]));
			exit(0);
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			print_usage(basename(argv[0]));
			exit(1);
			break;
		}
	}

	if ((argc - optind != 0) || (cmd == UNSPEC)) {
		print_usage(basename(argv[0]));
		exit(1);
	}

	if ((cmd == ADD || cmd == DEL) &&
	    ((!src_ifindex) || (!dst_ifindex))) {
		print_usage(basename(argv[0]));
		exit(1);
	}

	if (flags & CGW_FLAGS_CAN_FD) {
		if (modidx) {
			printf("No -m modifications allowed in CAN FD mode!\n");
			exit(1);
		}
	} else {
		if (fdmodidx) {
			printf("No -M modifications allowed in Classic CAN mode!\n");
			exit(1);
		}
	}

	if ((!modidx && !fdmodidx) && (have_cs_crc8 || have_cs_xor)) {
		printf("-c or -x can only be used in conjunction with -m/-M\n");
		exit(1);
	}

	s = socket(PF_NETLINK, SOCK_RAW, NETLINK_ROUTE);

	switch (cmd) {

	case ADD:
		req.nh.nlmsg_flags = NLM_F_REQUEST | NLM_F_ACK;
		req.nh.nlmsg_type  = RTM_NEWROUTE;
		break;

	case DEL:
		req.nh.nlmsg_flags = NLM_F_REQUEST | NLM_F_ACK;
		req.nh.nlmsg_type  = RTM_DELROUTE;
		break;

	case FLUSH:
		req.nh.nlmsg_flags = NLM_F_REQUEST | NLM_F_ACK;
		req.nh.nlmsg_type  = RTM_DELROUTE;
		/* if_index set to 0 => remove all entries */
		src_ifindex  = 0;
		dst_ifindex  = 0;
		break;

	case LIST:
		req.nh.nlmsg_flags = NLM_F_REQUEST | NLM_F_DUMP;
		req.nh.nlmsg_type  = RTM_GETROUTE;
		break;

	default:
		printf("This function is not yet implemented.\n");
		exit(1);
		break;
	}

	req.nh.nlmsg_len   = NLMSG_LENGTH(sizeof(struct rtcanmsg));
	req.nh.nlmsg_seq   = 0;

	req.rtcan.can_family  = AF_CAN;
	req.rtcan.gwtype = CGW_TYPE_CAN_CAN;
	req.rtcan.flags = flags;

	addattr_l(&req.nh, sizeof(req), CGW_SRC_IF, &src_ifindex, sizeof(src_ifindex));
	addattr_l(&req.nh, sizeof(req), CGW_DST_IF, &dst_ifindex, sizeof(dst_ifindex));

	/* add new attributes here */

	if (have_filter)
		addattr_l(&req.nh, sizeof(req), CGW_FILTER, &filter, sizeof(filter));

	if (have_cs_crc8)
		addattr_l(&req.nh, sizeof(req), CGW_CS_CRC8, &cs_crc8, sizeof(cs_crc8));

	if (have_cs_xor)
		addattr_l(&req.nh, sizeof(req), CGW_CS_XOR, &cs_xor, sizeof(cs_xor));

	if (uid)
		addattr_l(&req.nh, sizeof(req), CGW_MOD_UID, &uid, sizeof(__u32));

	if (limit_hops)
		addattr_l(&req.nh, sizeof(req), CGW_LIM_HOPS, &limit_hops, sizeof(__u8));

	/*
	 * a better example code
	 * modmsg.modtype = CGW_MOD_ID;
	 * addattr_l(&req.n, sizeof(req), CGW_MOD_SET, &modmsg, CGW_MODATTR_LEN);
	 */

	/* add up to CGW_MOD_FUNCS modification definitions */
	for (i = 0; i < modidx; i++)
		addattr_l(&req.nh, sizeof(req), modmsg[i].instruction, &modmsg[i], CGW_MODATTR_LEN);

	/* add up to CGW_FDMOD_FUNCS modification definitions */
	for (i = 0; i < fdmodidx; i++)
		addattr_l(&req.nh, sizeof(req), fdmodmsg[i].instruction, &fdmodmsg[i], CGW_FDMODATTR_LEN);

	memset(&nladdr, 0, sizeof(nladdr));
	nladdr.nl_family = AF_NETLINK;
	nladdr.nl_pid    = 0;
	nladdr.nl_groups = 0;

	err = sendto(s, &req, req.nh.nlmsg_len, 0,
		     (struct sockaddr*)&nladdr, sizeof(nladdr));
	if (err < 0) {
		perror("netlink sendto");
		return err;
	}

	/* clean netlink receive buffer */
	memset(rxbuf, 0x0, sizeof(rxbuf));

	if (cmd != LIST) {

		/*
		 * cmd == ADD || cmd == DEL || cmd == FLUSH
		 *
		 * Parse the requested netlink acknowledge return values.
		 */

		err = recv(s, &rxbuf, sizeof(rxbuf), 0);
		if (err < 0) {
			perror("netlink recv");
			return err;
		}
		nlh = (struct nlmsghdr *)rxbuf;
		if (nlh->nlmsg_type != NLMSG_ERROR) {
			fprintf(stderr, "unexpected netlink answer of type %d\n", nlh->nlmsg_type);
			return -EINVAL;
		}
		rte = (struct nlmsgerr *)NLMSG_DATA(nlh);
		err = rte->error;
		if (err < 0)
			fprintf(stderr, "netlink error %d (%s)\n", err, strerror(abs(err)));

	} else {

		/* cmd == LIST */

		while (1) {
			len = recv(s, &rxbuf, sizeof(rxbuf), 0);
			if (len < 0) {
				perror("netlink recv");
				return len;
			}
#if 0
			printf("received msg len %d\n", len);

			for (i = 0; i < len; i++)
				printf("%02X ", rxbuf[i]);

			printf("\n");
#endif
			/* leave on errors or NLMSG_DONE */
			if (parse_rtlist(argv[0], rxbuf, len))
				break;
		}
	}

	close(s);

	return err;
}